

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.test.cpp
# Opt level: O1

TileData *
setTileInPool<tiles::Input>
          (TileData *__return_storage_ptr__,TilePool *pool,size_t sectorId,uint offset,
          TileData expected,Input *tileType,t tileId)

{
  t tVar1;
  uint offset_00;
  bool bVar2;
  TileData *pTVar3;
  t tVar4;
  Tile *this;
  AssertionHandler catchAssertionHandler;
  t local_109;
  uint local_108;
  TileData local_104;
  Input *local_100;
  TileData local_f4;
  AssertionHandler local_f0;
  Tile local_a8;
  ITransientExpression local_90;
  StringRef *local_80;
  TileType *local_78;
  Chunk *pCStack_70;
  TileData *local_68;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_90._vptr_ITransientExpression = (_func_int **)0x222123;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_a8.tileType_ = (TileType *)0x224fbc;
  local_a8.chunk_ = (Chunk *)0x16;
  local_109 = tileId;
  local_104 = (TileData)offset;
  local_100 = tileType;
  Catch::StringRef::StringRef
            (&local_40,"pool.accessTile(sectorId, offset).getRawData() == expected");
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,(StringRef *)&local_90,(SourceLineInfo *)&local_a8,local_40,Normal);
  local_108 = (uint)sectorId;
  this = (Tile *)__return_storage_ptr__;
  TilePool::accessTile(&local_a8,(TilePool *)__return_storage_ptr__,(size_t)pool,local_108);
  pTVar3 = Tile::getRawData((TileData *)&local_a8,this);
  local_f4 = SUB84(pTVar3,0);
  bVar2 = operator==(&local_f4,&local_104);
  Catch::StringRef::StringRef(&local_60,"==");
  local_90.m_result = bVar2;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00292f00;
  pCStack_70 = (Chunk *)local_60.m_size;
  local_80 = (StringRef *)&local_f4;
  local_68 = &local_104;
  Catch::AssertionHandler::handleExpr(&local_f0,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  offset_00 = local_108;
  TilePool::accessTile((Tile *)&local_f0,(TilePool *)__return_storage_ptr__,(size_t)pool,local_108);
  Tile::setType((Tile *)&local_f0,local_100,local_109,low,' ');
  TilePool::accessTile((Tile *)&local_f0,(TilePool *)__return_storage_ptr__,(size_t)pool,offset_00);
  pTVar3 = Tile::getRawData((TileData *)&local_f0,(Tile *)__return_storage_ptr__);
  local_108 = (uint)pTVar3;
  tVar4 = (t)pTVar3 & (gateXor|gateNor);
  local_90._vptr_ITransientExpression = (_func_int **)0x222123;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_a8.tileType_ = (TileType *)0x224fbc;
  local_a8.chunk_ = (Chunk *)0x19;
  Catch::StringRef::StringRef(&local_50,"result.id == tileId");
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,(StringRef *)&local_90,(SourceLineInfo *)&local_a8,local_50,Normal);
  tVar1 = local_109;
  local_60.m_start._0_1_ = tVar4;
  Catch::StringRef::StringRef((StringRef *)&local_a8,"==");
  local_90.m_result = tVar4 == tVar1;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00292f40;
  local_78 = local_a8.tileType_;
  pCStack_70 = local_a8.chunk_;
  local_80 = &local_60;
  local_68 = (TileData *)&local_109;
  Catch::AssertionHandler::handleExpr(&local_f0,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return (TileData *)(ulong)local_108;
}

Assistant:

TileData setTileInPool(TilePool& pool, size_t sectorId, unsigned int offset, TileData expected, T* tileType, TileId::t tileId) {
    REQUIRE(pool.accessTile(sectorId, offset).getRawData() == expected);
    pool.accessTile(sectorId, offset).setType(tileType, tileId);
    TileData result = pool.accessTile(sectorId, offset).getRawData();
    REQUIRE(result.id == tileId);
    return result;
}